

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O2

vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_> *
__thiscall
hrgls::API::GetAvailableDataBlobSources
          (vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
           *__return_storage_ptr__,API *this)

{
  vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_> *ret;
  
  if (this->m_private == (API_private *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
    ::vector(__return_storage_ptr__,&this->m_private->rends);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::vector<DataBlobSourceDescription> API::GetAvailableDataBlobSources() const
  {
    if (!m_private) {
      ::std::vector<DataBlobSourceDescription> ret;
      return ret;
    } else {
      return m_private->rends;
    }
  }